

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRaw<int>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  long *plVar1;
  
  if (field[0x34] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x38) + 0x30);
  }
  else if (*(long *)(field + 0x40) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x20) + 0x80);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x40) + 0x70);
  }
  return (int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (long)this->offsets_[(int)((ulong)((long)field - *plVar1) >> 3) * -0x11111111]);
}

Assistant:

inline Type* GeneratedMessageReflection::MutableRaw(
    Message* message, const FieldDescriptor* field) const {
  void* ptr = reinterpret_cast<uint8*>(message) + offsets_[field->index()];
  return reinterpret_cast<Type*>(ptr);
}